

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAmbientLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  undefined8 *in_RDX;
  string *childID;
  Vec3fa VVar2;
  Vec3fa L;
  undefined1 local_50 [16];
  element_type *peStack_40;
  undefined2 *local_30;
  ssize_t local_28;
  undefined2 local_20 [8];
  
  childID = (string *)*in_RDX;
  local_20[0] = 0x4c;
  local_28 = 1;
  local_30 = local_20;
  XML::child((XML *)local_50,childID);
  VVar2 = load<embree::Vec3fa>((XMLLoader *)(local_50 + 8),(Ref<embree::XML> *)childID);
  if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_50._0_8_ + 0x18))(VVar2.field_0._0_4_,VVar2.field_0._8_8_);
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  pcVar1 = (pointer)alignedMalloc(0x90,0x10);
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  *(pointer *)(pcVar1 + 0x10) = pcVar1 + 0x20;
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  *(pointer *)(pcVar1 + 0x30) = pcVar1 + 0x40;
  pcVar1[0x38] = '\0';
  pcVar1[0x39] = '\0';
  pcVar1[0x3a] = '\0';
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x40] = '\0';
  pcVar1[0x50] = '\0';
  pcVar1[0x51] = '\0';
  pcVar1[0x52] = '\0';
  pcVar1[0x53] = '\0';
  pcVar1[0x54] = '\0';
  pcVar1[0x55] = '\0';
  pcVar1[0x56] = '\0';
  pcVar1[0x57] = '\0';
  pcVar1[0x58] = '\0';
  pcVar1[0x59] = '\0';
  pcVar1[0x5c] = -1;
  pcVar1[0x5d] = -1;
  pcVar1[0x5e] = -1;
  pcVar1[0x5f] = -1;
  pcVar1[0x60] = '\0';
  pcVar1[0x61] = '\0';
  pcVar1[0x62] = '\0';
  pcVar1[99] = '\0';
  pcVar1[100] = '\0';
  pcVar1[0x65] = '\0';
  pcVar1[0x66] = '\0';
  pcVar1[0x67] = '\0';
  *(undefined ***)pcVar1 = &PTR__Node_002cd770;
  pcVar1[0x70] = '\0';
  pcVar1[0x71] = '\0';
  pcVar1[0x72] = '\0';
  pcVar1[0x73] = '\0';
  ((__atomic_base<unsigned_long> *)(pcVar1 + 0x80))->_M_i = local_50._8_8_;
  *(element_type **)(pcVar1 + 0x88) = peStack_40;
  (this->path).filename._M_dataplus._M_p = pcVar1;
  LOCK();
  *(long *)(pcVar1 + 8) = *(long *)(pcVar1 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAmbientLight(const Ref<XML>& xml) 
  {
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    return new SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>(SceneGraph::AmbientLight(L));
  }